

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateVirtualFunctionSet
          (ExpressionContext *ctx,SynBase *source,ExprBase *value,InplaceStr name,TypeClass *parent)

{
  DirectChainedMap<FunctionData_*> *this;
  FunctionData *pFVar1;
  TypeFunction *pTVar2;
  uint hash;
  int iVar3;
  undefined4 extraout_var;
  TypeFunctionSet *pTVar5;
  ExprBase *pEVar6;
  IntrusiveList<FunctionHandle> *pIVar7;
  ArrayView<TypeBase_*> setTypes;
  NodeIterator it;
  TypeFunction *local_f0;
  InplaceStr name_local;
  IntrusiveList<FunctionHandle> functions;
  SmallArray<TypeBase_*,_16U> types;
  FunctionHandle *pFVar4;
  undefined4 extraout_var_00;
  
  name_local.end = name.end;
  name_local.begin = name.begin;
  types.allocator = ctx->allocator;
  types.data = types.little;
  types.count = 0;
  types.max = 0x10;
  functions.head = (FunctionHandle *)0x0;
  functions.tail = (FunctionHandle *)0x0;
  do {
    if (parent == (TypeClass *)0x0) {
      if (functions.head == (FunctionHandle *)0x0) {
        if ((TypeStruct *)value->type == ctx->typeAutoRef) {
          anon_unknown.dwarf_b837c::Stop
                    (ctx,source,"ERROR: function \'%.*s\' is undefined in any of existing classes",
                     (ulong)(uint)((int)name_local.end - (int)name_local.begin));
        }
        pEVar6 = (ExprBase *)0x0;
      }
      else {
        setTypes.count = types.count;
        setTypes.data = types.data;
        setTypes._12_4_ = 0;
        pTVar5 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
        pEVar6->typeID = 0x27;
        pEVar6->source = source;
        pEVar6->type = &pTVar5->super_TypeBase;
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240e70;
        pEVar6[1]._vptr_ExprBase = (_func_int **)functions.head;
        *(FunctionHandle **)&pEVar6[1].typeID = functions.tail;
        pEVar6[1].source = (SynBase *)value;
      }
      SmallArray<TypeBase_*,_16U>::~SmallArray(&types);
      return pEVar6;
    }
    hash = InplaceStr::hash(&name_local);
    this = &parent->methodMap;
    it = DirectChainedMap<FunctionData_*>::first(this,hash);
    while (it.node != (Node *)0x0) {
      pFVar1 = *(FunctionData **)(it.node + 8);
      pTVar2 = pFVar1->type;
      pIVar7 = &functions;
      if ((pTVar2->super_TypeBase).isGeneric == false) {
        do {
          pFVar4 = pIVar7->head;
          if (pFVar4 == (FunctionHandle *)0x0) goto LAB_00164cc1;
          pIVar7 = (IntrusiveList<FunctionHandle> *)&pFVar4->next;
        } while (pFVar4->function->type != pTVar2);
        it = DirectChainedMap<FunctionData_*>::next(this,it);
      }
      else {
LAB_00164cc1:
        local_f0 = pTVar2;
        SmallArray<TypeBase_*,_16U>::push_back(&types,(TypeBase **)&local_f0);
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        pFVar4 = (FunctionHandle *)CONCAT44(extraout_var,iVar3);
        pFVar4->function = pFVar1;
        pFVar4->next = (FunctionHandle *)0x0;
        pFVar4->listed = false;
        IntrusiveList<FunctionHandle>::push_back(&functions,pFVar4);
        it = DirectChainedMap<FunctionData_*>::next(this,it);
      }
    }
    parent = parent->baseClass;
  } while( true );
}

Assistant:

ExprBase* CreateVirtualFunctionSet(ExpressionContext &ctx, SynBase *source, ExprBase *value, InplaceStr name, TypeClass *parent)
{
	SmallArray<TypeBase*, 16> types(ctx.allocator);
	IntrusiveList<FunctionHandle> functions;

	for(TypeClass *curr = parent; curr; curr = curr->baseClass)
	{
		DirectChainedMap<FunctionData*>::NodeIterator it = curr->methodMap.first(name.hash());

		while(it)
		{
			FunctionData *function = it.node->value;

			FunctionHandle *prev = NULL;

			// Pointer to generic types don't stricly match because they might be resolved to different types
			if(!function->type->isGeneric)
			{
				for(FunctionHandle *curr = functions.head; curr; curr = curr->next)
				{
					if(curr->function->type == function->type)
					{
						prev = curr;
						break;
					}
				}
			}

			if(prev)
			{
				it = curr->methodMap.next(it);
				continue;
			}

			types.push_back(function->type);
			functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(function));

			it = curr->methodMap.next(it);
		}
	}

	if(functions.empty())
	{
		if(value->type != ctx.typeAutoRef)
			return NULL;

		Stop(ctx, source, "ERROR: function '%.*s' is undefined in any of existing classes", FMT_ISTR(name));
	}

	TypeFunctionSet *type = ctx.GetFunctionSetType(types);

	return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, functions, value);
}